

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O2

void __thiscall xray_re::_lzhuf::StartHuff(_lzhuf *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  for (lVar1 = -0x4e8; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->freq + lVar1 + 0x4e8) = 1;
    *(int *)((long)this->son + lVar1 + 0x4e8) = iVar2 + 0x273;
    *(int *)((long)this->son + lVar1) = iVar2;
    iVar2 = iVar2 + 1;
  }
  iVar2 = 0;
  for (lVar1 = -0x139; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->prnt[lVar1 + -1] = this->prnt[lVar1 * 2 + -1] + this->prnt[lVar1 * 2 + -2];
    *(int *)((long)&this->textsize + lVar1 * 4) = iVar2;
    iVar3 = (int)lVar1 + 0x273;
    this->prnt[lVar1 * 2 + 0x273] = iVar3;
    this->prnt[lVar1 * 2 + 0x272] = iVar3;
    iVar2 = iVar2 + 2;
  }
  this->freq[0x273] = 0xffff;
  this->prnt[0x272] = 0;
  return;
}

Assistant:

void _lzhuf::StartHuff(void)
{
	int i, j;

	for (i = 0; i < N_CHAR; i++) {
		freq[i] = 1;
		son[i] = i + T;
		prnt[i + T] = i;
	}
	i = 0; j = N_CHAR;
	while (j <= R) {
		freq[j] = freq[i] + freq[i + 1];
		son[j] = i;
		prnt[i] = prnt[i + 1] = j;
		i += 2; j++;
	}
	freq[T] = 0xffff;
	prnt[R] = 0;
}